

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# schema-parser-test.c++
# Opt level: O2

void __thiscall
capnp::anon_unknown_0::FakeFileReader::add(FakeFileReader *this,StringPtr name,StringPtr content)

{
  String *pSVar1;
  PathPtr path;
  Own<const_kj::File> OStack_48;
  Array<kj::String> local_38;
  
  pSVar1 = (String *)(this->root).ptr;
  kj::Path::eval((Path *)&local_38,&this->cwd,name);
  path.parts.size_ = (size_t)local_38.ptr;
  path.parts.ptr = pSVar1;
  kj::Directory::openFile((Directory *)&OStack_48,path,(WriteMode)local_38.size_);
  kj::File::writeAll(OStack_48.ptr,content);
  kj::Own<const_kj::File>::dispose(&OStack_48);
  kj::Array<kj::String>::~Array(&local_38);
  return;
}

Assistant:

void add(kj::StringPtr name, kj::StringPtr content) {
    root->openFile(cwd.evalNative(name), kj::WriteMode::CREATE | kj::WriteMode::CREATE_PARENT)
        ->writeAll(content);
  }